

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O1

uint32_t address_space_lduw_be_mips64el
                   (uc_struct_conflict7 *uc,AddressSpace *as,hwaddr addr,MemTxAttrs attrs,
                   MemTxResult *result)

{
  MemTxResult MVar1;
  MemoryRegion *mr;
  ushort *puVar2;
  hwaddr addr1;
  uint64_t val;
  hwaddr l;
  ram_addr_t local_38;
  uint local_30 [2];
  hwaddr local_28;
  
  local_28 = 2;
  mr = flatview_translate_mips64el(uc,as->current_map,addr,&local_38,&local_28,false,attrs);
  if ((local_28 < 2) || (mr->ram == false)) {
    MVar1 = memory_region_dispatch_read_mips64el(uc,mr,local_38,(uint64_t *)local_30,MO_BEUW,attrs);
  }
  else {
    puVar2 = (ushort *)qemu_map_ram_ptr_mips64el(mr->uc,mr->ram_block,local_38);
    local_30[0] = (uint)(ushort)(*puVar2 << 8 | *puVar2 >> 8);
    MVar1 = 0;
  }
  if (result != (MemTxResult *)0x0) {
    *result = MVar1;
  }
  return local_30[0];
}

Assistant:

uint32_t glue(address_space_lduw_be, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, MemTxAttrs attrs, MemTxResult *result)
{
    return glue(address_space_lduw_internal, SUFFIX)(uc, ARG1, addr, attrs, result,
                                       DEVICE_BIG_ENDIAN);
}